

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void parasail_sequences_free(parasail_sequences_t *sequences)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  
  if (sequences->l != 0) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      pvVar1 = *(void **)((long)&(sequences->seqs->name).s + lVar2);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
      }
      pvVar1 = *(void **)((long)&(sequences->seqs->comment).s + lVar2);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
      }
      pvVar1 = *(void **)((long)&(sequences->seqs->seq).s + lVar2);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
      }
      pvVar1 = *(void **)((long)&(sequences->seqs->qual).s + lVar2);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x40;
    } while (uVar3 < sequences->l);
  }
  free(sequences->seqs);
  free(sequences);
  return;
}

Assistant:

void parasail_sequences_free(parasail_sequences_t *sequences)
{
    size_t i;
    for (i=0; i<sequences->l; ++i) {
        if (sequences->seqs[i].name.s)    free(sequences->seqs[i].name.s);
        if (sequences->seqs[i].comment.s) free(sequences->seqs[i].comment.s);
        if (sequences->seqs[i].seq.s)     free(sequences->seqs[i].seq.s);
        if (sequences->seqs[i].qual.s)    free(sequences->seqs[i].qual.s);
    }
    free(sequences->seqs);
    free(sequences);
}